

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.h
# Opt level: O0

void __thiscall
slang::analysis::DataFlowAnalysis::LSPVisitor<slang::analysis::DataFlowAnalysis>::handle
          (LSPVisitor<slang::analysis::DataFlowAnalysis> *this,ElementSelectExpression *expr)

{
  bool bVar1;
  EvalContext *in_RSI;
  ElementSelectExpression *in_RDI;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_analysis_DataFlowAnalysis_h:219:33)>
  guard;
  Expression *in_stack_ffffffffffffff98;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState> *this_00;
  DataFlowAnalysis *in_stack_ffffffffffffffc8;
  ElementSelectExpression *this_01;
  
  this_01 = in_RDI;
  FlowAnalysisBase::getEvalContext(*(FlowAnalysisBase **)&in_RDI->super_Expression);
  bVar1 = slang::ast::ElementSelectExpression::isConstantSelect(this_01,in_RSI);
  if (bVar1) {
    if ((in_RDI->super_Expression).type.ptr == (Type *)0x0) {
      (in_RDI->super_Expression).type.ptr = (Type *)in_RSI;
    }
  }
  else {
    (in_RDI->super_Expression).type.ptr = (Type *)0x0;
  }
  this_00 = *(AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
              **)&in_RDI->super_Expression;
  slang::ast::ElementSelectExpression::value((ElementSelectExpression *)in_RSI);
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::
  visit<slang::ast::Expression>(this_00,in_stack_ffffffffffffff98);
  saveLValueFlag(in_stack_ffffffffffffffc8);
  slang::ast::ElementSelectExpression::selector((ElementSelectExpression *)in_RSI);
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::
  visit<slang::ast::Expression>(this_00,in_stack_ffffffffffffff98);
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/analysis/DataFlowAnalysis.h:219:33)>
  ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_analysis_DataFlowAnalysis_h:219:33)>
                 *)this_00);
  return;
}

Assistant:

void handle(const ElementSelectExpression& expr) {
            if (expr.isConstantSelect(owner.getEvalContext())) {
                if (!currentLSP)
                    currentLSP = &expr;
            }
            else {
                currentLSP = nullptr;
            }

            owner.visit(expr.value());

            [[maybe_unused]] auto guard = owner.saveLValueFlag();
            owner.visit(expr.selector());
        }